

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_c91b1::CreateIndex
                    (VmModule *module,SynBase *source,VmValue *arrayLength,VmValue *elementSize,
                    VmValue *value,VmValue *index,TypeBase *structType)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType VVar3;
  VmValue *in_stack_ffffffffffffffa0;
  SynBase *local_48;
  TypeBase *local_40;
  VmValue *index_local;
  VmValue *value_local;
  VmValue *elementSize_local;
  VmValue *arrayLength_local;
  SynBase *source_local;
  VmModule *module_local;
  
  bVar1 = VmType::operator==(&arrayLength->type,&VmType::Int);
  if (!bVar1) {
    __assert_fail("arrayLength->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x20d,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  bVar1 = VmType::operator==(&elementSize->type,&VmType::Int);
  if (!bVar1) {
    __assert_fail("elementSize->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x20e,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  if ((value->type).type != VM_TYPE_POINTER) {
    __assert_fail("value->type.type == VM_TYPE_POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x20f,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  bVar1 = VmType::operator==(&index->type,&VmType::Int);
  if (!bVar1) {
    __assert_fail("index->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x210,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  VVar3 = VmType::Pointer(structType);
  local_48 = VVar3._0_8_;
  local_40 = VVar3.structType;
  VVar3.structType = (TypeBase *)0x16;
  VVar3._0_8_ = local_40;
  pVVar2 = CreateInstruction((anon_unknown_dwarf_c91b1 *)module,(VmModule *)source,local_48,VVar3,
                             (VmInstructionType)arrayLength,elementSize,value,index,
                             in_stack_ffffffffffffffa0);
  return &pVVar2->super_VmValue;
}

Assistant:

VmValue* CreateIndex(VmModule *module, SynBase *source, VmValue *arrayLength, VmValue *elementSize, VmValue *value, VmValue *index, TypeBase *structType)
	{
		assert(arrayLength->type == VmType::Int);
		assert(elementSize->type == VmType::Int);
		assert(value->type.type == VM_TYPE_POINTER);
		assert(index->type == VmType::Int);

		return CreateInstruction(module, source, VmType::Pointer(structType), VM_INST_INDEX, arrayLength, elementSize, value, index);
	}